

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void nni_stat_inc(nni_stat_item *item,uint64_t inc)

{
  anon_union_8_5_0a23ca40_for_si_u *v;
  
  v = &item->si_u;
  if ((item->si_info->field_0x18 & 1) != 0) {
    nni_atomic_add64(&v->sv_atomic,inc);
    return;
  }
  v->sv_string = v->sv_string + inc;
  return;
}

Assistant:

void
nni_stat_inc(nni_stat_item *item, uint64_t inc)
{
#ifdef NNG_ENABLE_STATS
	if (item->si_info->si_atomic) {
		nni_atomic_add64(&item->si_u.sv_atomic, inc);
	} else {
		item->si_u.sv_number += inc;
	}
#else
	NNI_ARG_UNUSED(item);
	NNI_ARG_UNUSED(inc);
#endif
}